

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::itemoutputgul(gulcalc *this,gulitemSampleslevel *gg)

{
  uchar *puVar1;
  gulSampleslevelRec r;
  gulSampleslevelRec r_1;
  gulitemSampleslevel *gg_local;
  gulcalc *this_local;
  
  if ((this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) ||
     (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0)) {
    if (15999 < this->itembufoffset_) {
      if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        (*this->itemWriter_)(this->ibuf_,1,this->itembufoffset_);
      }
      if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        (*this->lossWriter_)(this->ibuf_,1,this->itembufoffset_);
      }
      this->itembufoffset_ = 0;
    }
    if ((gg->event_id != lastitemheader.event_id) || (gg->item_id != lastitemheader.item_id)) {
      if ((this->isFirstItemEvent_ & 1U) == 0) {
        puVar1 = this->ibuf_ + this->itembufoffset_;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        this->itembufoffset_ = this->itembufoffset_ + 8;
      }
      else {
        this->isFirstItemEvent_ = false;
      }
      lastitemheader.event_id = gg->event_id;
      lastitemheader.item_id = gg->item_id;
      *(undefined8 *)(this->ibuf_ + this->itembufoffset_) = *(undefined8 *)gg;
      this->itembufoffset_ = this->itembufoffset_ + 8;
    }
    *(undefined8 *)(this->ibuf_ + this->itembufoffset_) = *(undefined8 *)&gg->sidx;
    this->itembufoffset_ = this->itembufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::itemoutputgul(gulitemSampleslevel &gg)
{
	if (itemWriter_ == 0 && lossWriter_ == 0)  return;
	if (itembufoffset_ >= bufsize) {
		if (itemWriter_) itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		if (lossWriter_) lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		itembufoffset_ = 0;
	}

	if (gg.event_id != lastitemheader.event_id || gg.item_id != lastitemheader.item_id) {
		if (isFirstItemEvent_ == false){
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
			itembufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstItemEvent_ = false;
		}
		lastitemheader.event_id = gg.event_id;
		lastitemheader.item_id = gg.item_id;
		memcpy(ibuf_ + itembufoffset_, &lastitemheader, sizeof(lastitemheader));
		itembufoffset_ += sizeof(lastitemheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;    
	memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
	itembufoffset_ += sizeof(gulSampleslevelRec);

}